

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pdVar1;
  pointer ppVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  type tVar8;
  type tVar9;
  type tVar10;
  size_type sVar11;
  size_type sVar12;
  ulong uVar13;
  pointer ppVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  pair<int,_int> pVar18;
  ulong uVar19;
  int i;
  int iVar20;
  float fVar21;
  pair<unsigned_long,_unsigned_long> pVar22;
  Settings __tmp;
  pair<google::dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  p_2;
  pair<google::dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  p;
  size_type expected_buckets;
  TypeParam other_ht;
  hasher hasher;
  pair<google::dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_238;
  float local_218;
  float fStack_214;
  ulong uStack_210;
  key_equal local_208;
  undefined1 local_1f8 [8];
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_1f0;
  pointer ppStack_1e8;
  pointer local_1e0;
  size_type sStack_1d8;
  float local_1d0;
  float fStack_1cc;
  ulong uStack_1c8;
  Hasher local_1c0;
  type local_1b4;
  type tStack_1ac;
  size_type local_1a0;
  size_type sStack_198;
  ulong local_190;
  pointer local_178;
  undefined1 local_170 [8];
  pointer local_168;
  pointer ppStack_160;
  ulong local_158;
  ulong uStack_150;
  float local_148;
  float fStack_144;
  undefined8 uStack_140;
  Hasher local_138;
  pair<int,_int> local_12c;
  type tStack_124;
  size_type local_118;
  size_type sStack_110;
  ulong local_108;
  pointer local_f0;
  pair<int,_int> local_e8;
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_e0;
  Hasher local_58;
  Hasher local_4c [2];
  
  local_4c[0].id_ = 1;
  local_4c[0].num_hashes_ = 0;
  local_4c[0].num_compares_ = 0;
  local_170 = (undefined1  [8])((ulong)local_170 & 0xffffffff00000000);
  local_168 = (pointer)0x0;
  google::
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (&local_e0,200,(hasher *)local_4c,(key_equal *)local_4c,(allocator_type *)local_170);
  pVar18 = UniqueObjectHelper<std::pair<int,int>>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  ((type *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info + 0xc))->first = pVar18.first;
  *(int *)((long)&(this->
                  super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.key_info + 0x10) = pVar18.second;
  pVar18 = UniqueObjectHelper<std::pair<int,int>>(2);
  this_01 = &local_e0.
             super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_01->rep);
  local_e0.
  super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.settings.
  super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_e0.
  super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.key_info.delkey.first = pVar18.first;
  local_e0.
  super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.key_info.delkey.second = pVar18.second;
  iVar20 = 3;
  do {
    local_1f8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(iVar20);
    google::
    dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<std::pair<int,int>const&,std::pair<int,int>const&>
              ((pair<google::dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)local_170,
               (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)this_00,(pair<int,_int> *)local_1f8,(pair<int,_int> *)local_1f8);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 2000);
  local_170 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(1000);
  google::
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,(key_type *)local_170);
  local_1f8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(0x7d1);
  google::
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_01->rep,1);
  google::
  dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<std::pair<int,int>const&,std::pair<int,int>const&>
            ((pair<google::dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_170,
             (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_01,(pair<int,_int> *)local_1f8,(pair<int,_int> *)local_1f8);
  local_e8.first =
       (undefined4)
       local_e0.
       super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_buckets;
  local_e8.second =
       local_e0.
       super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_buckets._4_4_;
  google::
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::swap(&this_00->rep,&this_01->rep);
  local_1f8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(2);
  local_238.first.ht =
       *(dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.key_info + 0xc);
  testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
            ((internal *)local_170,"this->UniqueKey(2)","this->ht_.deleted_key()",
             (pair<int,_int> *)local_1f8,(pair<int,_int> *)&local_238);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1db,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_1f8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(1);
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_e0.
                   super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info.delkey.second,
                   local_e0.
                   super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info.delkey.first);
  testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
            ((internal *)local_170,"this->UniqueKey(1)","other_ht.deleted_key()",
             (pair<int,_int> *)local_1f8,(pair<int,_int> *)&local_238);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1dc,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_1f8._0_4_ = 1;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.ht._4_4_,
                   (this_00->rep).settings.
                   super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                   .super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_170,"1","this->ht_.hash_funct().id()",(int *)local_1f8,
             (int *)&local_238);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1de,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffff00000000);
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.ht._4_4_,
                   local_e0.
                   super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings.
                   super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                   .super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_170,"0","other_ht.hash_funct().id()",(int *)local_1f8,
             (int *)&local_238);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1df,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_1f8._0_4_ = 1;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.ht._4_4_,
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info.super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_170,"1","this->ht_.key_eq().id()",(int *)local_1f8,(int *)&local_238)
  ;
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e1,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffff00000000);
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.ht._4_4_,
                   local_e0.
                   super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info.super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_170,"0","other_ht.key_eq().id()",(int *)local_1f8,(int *)&local_238);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e2,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_1f8 = *(undefined1 (*) [8])
               &(this->
                super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.num_buckets;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_170,"expected_buckets","this->ht_.bucket_count()",
             (unsigned_long *)&local_e8,(unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e4,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_1f8 = (undefined1  [8])
              local_e0.
              super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_buckets;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.ht._4_4_,200);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((internal *)local_170,"other_ht.bucket_count()","200u",(unsigned_long *)local_1f8,
             (uint *)&local_238);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e5,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.ht._4_4_,1);
  local_1f8 = (undefined1  [8])
              ((this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"1u","this->ht_.size()",(uint *)&local_238,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e7,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.ht._4_4_,0x7cc);
  local_1f8 = (undefined1  [8])
              (local_e0.
               super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              local_e0.
              super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"1996u","other_ht.size()",(uint *)&local_238,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e8,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_208.super_Hasher._0_8_ = (ulong)(uint)local_208.super_Hasher.num_hashes_ << 0x20;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(0x6f);
  pVar22 = google::
           dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           ::find_position<std::pair<int,int>>
                     ((dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                       *)this_00,(pair<int,_int> *)&local_238);
  local_1f8._1_7_ = 0;
  local_1f8[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"0u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_208,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ea,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_208.super_Hasher.id_ = 1;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(0x6f);
  pVar22 = google::
           dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           ::find_position<std::pair<int,int>>
                     ((dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                       *)this_01,(pair<int,_int> *)&local_238);
  local_1f8._1_7_ = 0;
  local_1f8[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"1u","other_ht.count(this->UniqueKey(111))",(uint *)&local_208,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1eb,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_208.super_Hasher.id_ = 1;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(0x7d1);
  pVar22 = google::
           dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           ::find_position<std::pair<int,int>>
                     ((dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                       *)this_00,(pair<int,_int> *)&local_238);
  local_1f8._1_7_ = 0;
  local_1f8[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"1u","this->ht_.count(this->UniqueKey(2001))",(uint *)&local_208,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ec,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_208.super_Hasher._0_8_ = local_208.super_Hasher._0_8_ & 0xffffffff00000000;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(0x7d1);
  pVar22 = google::
           dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           ::find_position<std::pair<int,int>>
                     ((dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                       *)this_01,(pair<int,_int> *)&local_238);
  local_1f8._1_7_ = 0;
  local_1f8[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"0u","other_ht.count(this->UniqueKey(2001))",(uint *)&local_208,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ed,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_208.super_Hasher._0_8_ = local_208.super_Hasher._0_8_ & 0xffffffff00000000;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(1000);
  pVar22 = google::
           dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           ::find_position<std::pair<int,int>>
                     ((dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                       *)this_00,(pair<int,_int> *)&local_238);
  local_1f8._1_7_ = 0;
  local_1f8[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"0u","this->ht_.count(this->UniqueKey(1000))",(uint *)&local_208,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ee,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_208.super_Hasher._0_8_ = local_208.super_Hasher._0_8_ & 0xffffffff00000000;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(1000);
  pVar22 = google::
           dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           ::find_position<std::pair<int,int>>
                     ((dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                       *)this_01,(pair<int,_int> *)&local_238);
  local_1f8._1_7_ = 0;
  local_1f8[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"0u","other_ht.count(this->UniqueKey(1000))",(uint *)&local_208,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ef,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  google::
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::swap(&this_00->rep,&this_01->rep);
  local_1f8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(1);
  local_238.first.ht =
       *(dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.key_info + 0xc);
  testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
            ((internal *)local_170,"this->UniqueKey(1)","this->ht_.deleted_key()",
             (pair<int,_int> *)local_1f8,(pair<int,_int> *)&local_238);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fc,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_1f8 = (undefined1  [8])UniqueObjectHelper<std::pair<int,int>>(2);
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_e0.
                   super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info.delkey.second,
                   local_e0.
                   super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info.delkey.first);
  testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
            ((internal *)local_170,"this->UniqueKey(2)","other_ht.deleted_key()",
             (pair<int,_int> *)local_1f8,(pair<int,_int> *)&local_238);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fd,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffff00000000);
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.ht._4_4_,
                   (this_00->rep).settings.
                   super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                   .super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_170,"0","this->ht_.hash_funct().id()",(int *)local_1f8,
             (int *)&local_238);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fe,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_1f8._0_4_ = 1;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.ht._4_4_,
                   local_e0.
                   super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings.
                   super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                   .super_TransparentHasher.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_170,"1","other_ht.hash_funct().id()",(int *)local_1f8,
             (int *)&local_238);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ff,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.ht._4_4_,0x7cc);
  local_1f8 = (undefined1  [8])
              ((this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"1996u","this->ht_.size()",(uint *)&local_238,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x200,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_238.first.ht._4_4_,1);
  local_1f8 = (undefined1  [8])
              (local_e0.
               super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              local_e0.
              super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"1u","other_ht.size()",(uint *)&local_238,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x201,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_208.super_Hasher.id_ = 1;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(0x6f);
  pVar22 = google::
           dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           ::find_position<std::pair<int,int>>
                     ((dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                       *)this_00,(pair<int,_int> *)&local_238);
  local_1f8._1_7_ = 0;
  local_1f8[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"1u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_208,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x202,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_208.super_Hasher._0_8_ = local_208.super_Hasher._0_8_ & 0xffffffff00000000;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(0x6f);
  pVar22 = google::
           dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           ::find_position<std::pair<int,int>>
                     ((dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                       *)this_01,(pair<int,_int> *)&local_238);
  local_1f8._1_7_ = 0;
  local_1f8[0] = pVar22.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_170,"0u","other_ht.count(this->UniqueKey(111))",(uint *)&local_208,
             (unsigned_long *)local_1f8);
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1f8);
    if (local_168 == (pointer)0x0) {
      pVar18 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar18 = *local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x203,(char *)pVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((pair<int,_int>)local_1f8 != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_1f8 + 8))();
    }
  }
  ppVar2 = local_168;
  if (local_168 != (pointer)0x0) {
    if (*local_168 != (pair<int,_int>)(local_168 + 2)) {
      operator_delete((void *)*local_168);
    }
    operator_delete(ppVar2);
  }
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_238.first.pos = (pointer)((ulong)local_238.first.pos._4_4_ << 0x20);
  local_208.super_Hasher.id_ = 0;
  local_208.super_Hasher.num_hashes_ = 0;
  local_208.super_Hasher.num_compares_ = 0;
  local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffff00000000);
  local_1f0 = (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  google::
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_170,0,(hasher *)&local_238,&local_208,(allocator_type *)local_1f8);
  pVar18 = UniqueObjectHelper<std::pair<int,int>>(1);
  google::
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_168);
  uStack_140._0_3_ = CONCAT12(true,(undefined2)uStack_140);
  iVar20 = 2;
  local_12c = pVar18;
  do {
    local_238.first.ht =
         (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)UniqueObjectHelper<std::pair<int,int>>(iVar20);
    google::
    dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_168,1);
    google::
    dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<std::pair<int,int>const&,std::pair<int,int>const&>
              ((pair<google::dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)local_1f8,
               (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)&local_168,(pair<int,_int> *)&local_238,(pair<int,_int> *)&local_238);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 10000);
  local_208.super_Hasher.id_ = 0;
  local_208.super_Hasher.num_hashes_ = 0;
  local_208.super_Hasher.num_compares_ = 0;
  local_58.id_ = 0;
  local_58.num_hashes_ = 0;
  local_58.num_compares_ = 0;
  local_238.first.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_238.first.ht & 0xffffffff00000000);
  local_238.first.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_1f8,0,&local_208,(key_equal *)&local_58,(allocator_type *)&local_238);
  uVar17 = local_108;
  uVar15 = _local_148;
  ppVar14 = local_178;
  uVar13 = local_190;
  sVar12 = sStack_198;
  sVar11 = local_1a0;
  tVar10 = tStack_1ac;
  tVar8 = local_1b4;
  iVar20 = local_1c0.num_compares_;
  uVar6 = local_1c0._0_8_;
  uVar5 = uStack_1c8;
  uVar3 = _local_1d0;
  ppVar2 = ppStack_1e8;
  pdVar1 = local_1f0;
  local_218 = local_1d0;
  fStack_214 = fStack_1cc;
  uStack_210 = uStack_1c8;
  local_238.first.end = local_1e0;
  local_238._24_8_ = sStack_1d8;
  local_238.first.ht = local_1f0;
  local_238.first.pos = ppStack_1e8;
  local_1d0 = local_148;
  fStack_1cc = fStack_144;
  uVar4 = _local_1d0;
  local_1f0 = (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_168;
  ppStack_1e8 = ppStack_160;
  local_1d0 = (float)uVar3;
  fStack_1cc = SUB84(uVar3,4);
  local_148 = local_1d0;
  fStack_144 = fStack_1cc;
  uVar16 = _local_148;
  local_168 = (pointer)pdVar1;
  ppStack_160 = ppVar2;
  local_1c0.num_compares_ = local_138.num_compares_;
  local_1c0.id_ = local_138.id_;
  local_1c0.num_hashes_ = local_138.num_hashes_;
  uVar7 = local_1c0._0_8_;
  local_138.num_compares_ = iVar20;
  local_1c0.id_ = (int)uVar6;
  local_1c0.num_hashes_ = SUB84(uVar6,4);
  local_138.id_ = local_1c0.id_;
  local_138.num_hashes_ = local_1c0.num_hashes_;
  local_1b4.first = local_12c.first;
  local_1b4.second = local_12c.second;
  tVar9 = local_1b4;
  tStack_1ac = tStack_124;
  local_1b4.first = tVar8.first;
  local_1b4.second = tVar8.second;
  local_12c.first = local_1b4.first;
  local_12c.second = local_1b4.second;
  tStack_124 = tVar10;
  local_1a0 = local_118;
  sStack_198 = sStack_110;
  local_118 = sVar11;
  sStack_110 = sVar12;
  local_190 = local_108;
  local_108 = uVar13;
  local_178 = local_f0;
  local_f0 = ppVar14;
  local_1d0 = (float)uVar15;
  local_1d0 = local_1d0 * (float)uVar17;
  uVar19 = (ulong)local_1d0;
  local_1e0 = (pointer)((long)(local_1d0 - 9.223372e+18) & (long)uVar19 >> 0x3f | uVar19);
  fStack_1cc = SUB84(uVar15,4);
  fStack_1cc = (float)uVar17 * fStack_1cc;
  sStack_1d8 = (size_type)fStack_1cc;
  sStack_1d8 = (long)(fStack_1cc - 9.223372e+18) & (long)sStack_1d8 >> 0x3f | sStack_1d8;
  uStack_1c8 = uStack_140 & 0xffffffffffffff00;
  fVar21 = (float)uVar13;
  local_148 = (float)uVar3;
  local_148 = local_148 * fVar21;
  local_158 = (ulong)local_148;
  local_158 = (long)(local_148 - 9.223372e+18) & (long)local_158 >> 0x3f | local_158;
  fStack_144 = SUB84(uVar3,4);
  fVar21 = fVar21 * fStack_144;
  uStack_150 = (ulong)fVar21;
  uStack_150 = (long)(fVar21 - 9.223372e+18) & (long)uStack_150 >> 0x3f | uStack_150;
  uStack_140 = uVar5 & 0xffffffffffffff00;
  _local_1d0 = uVar4;
  local_1c0._0_8_ = uVar7;
  local_1b4 = tVar9;
  _local_148 = uVar16;
  pVar18 = UniqueObjectHelper<std::pair<int,int>>(1);
  google::
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_168);
  uStack_140._2_1_ = true;
  iVar20 = 2;
  local_12c = pVar18;
  do {
    local_208.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int,int>>(iVar20);
    google::
    dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_168,1);
    google::
    dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<std::pair<int,int>const&,std::pair<int,int>const&>
              (&local_238,
               (dense_hashtable<std::pair<int,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)&local_168,(pair<int,_int> *)&local_208,(pair<int,_int> *)&local_208);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 10000);
  local_1f8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c272d8;
  if (local_178 != (pointer)0x0) {
    free(local_178);
  }
  local_170 = (undefined1  [8])&PTR__BaseHashtableInterface_00c272d8;
  if (local_f0 != (pointer)0x0) {
    free(local_f0);
  }
  local_e0.
  super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c272d8;
  if (local_e0.
      super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.table != (pointer)0x0) {
    free(local_e0.
         super_BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}